

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::ipc::ClientImpl::TryConnect(ClientImpl *this)

{
  UnixSocket *this_00;
  allocator<char> local_39;
  UnixSocket *local_38;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,this->socket_name_,&local_39);
  base::UnixSocket::Connect
            ((UnixSocket *)&local_38,&local_30,&this->super_EventListener,this->task_runner_,kUnix,
             kStream,kIgnore);
  this_00 = (this->sock_)._M_t.
            super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
            ._M_t.
            super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
            .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl;
  (this->sock_)._M_t.
  super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
  .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl = local_38;
  if (this_00 != (UnixSocket *)0x0) {
    base::UnixSocket::~UnixSocket(this_00);
    operator_delete(this_00,0x40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ClientImpl::TryConnect() {
  PERFETTO_DCHECK(socket_name_);
  sock_ = base::UnixSocket::Connect(socket_name_, this, task_runner_,
                                    kClientSockFamily, base::SockType::kStream,
                                    base::SockPeerCredMode::kIgnore);
}